

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O2

Validator * __thiscall CLI::Option::get_validator(Option *this,string *Validator_name)

{
  Validator *pVVar1;
  __type _Var2;
  OptionNotFound *this_00;
  Validator *Validator;
  Validator *pVVar3;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pVVar1 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar3 = (this->validators_).
                super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar3 != pVVar1; pVVar3 = pVVar3 + 1) {
    _Var2 = ::std::operator==(Validator_name,&pVVar3->name_);
    if (_Var2) {
      return pVVar3;
    }
  }
  if ((Validator_name->_M_string_length == 0) &&
     (pVVar3 = (this->validators_).
               super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
               super__Vector_impl_data._M_start,
     pVVar3 != (this->validators_).
               super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
    return pVVar3;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_88,"Validator ",&local_89);
  ::std::operator+(&local_68,&local_88,Validator_name);
  ::std::operator+(&local_48,&local_68," Not Found");
  OptionNotFound::OptionNotFound(this_00,&local_48);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE Validator *Option::get_validator(const std::string &Validator_name) {
    for(auto &Validator : validators_) {
        if(Validator_name == Validator.get_name()) {
            return &Validator;
        }
    }
    if((Validator_name.empty()) && (!validators_.empty())) {
        return &(validators_.front());
    }
    throw OptionNotFound(std::string{"Validator "} + Validator_name + " Not Found");
}